

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZEqnArray<std::complex<long_double>_>_>::Resize
          (TPZVec<TPZEqnArray<std::complex<long_double>_>_> *this,int64_t newsize,
          TPZEqnArray<std::complex<long_double>_> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  int iVar4;
  void *pvVar5;
  TPZEqnArray<std::complex<long_double>_> *pTVar6;
  ulong uVar7;
  TPZEqnArray<std::complex<long_double>_> *pTVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      pTVar8 = (TPZEqnArray<std::complex<long_double>_> *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar7 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x9060),8) == 0) {
        uVar7 = SUB168(auVar3 * ZEXT816(0x9060),0) | 0x10;
      }
      pvVar5 = operator_new__(uVar7);
      *(int64_t *)((long)pvVar5 + 8) = newsize;
      pTVar8 = (TPZEqnArray<std::complex<long_double>_> *)((long)pvVar5 + 0x10);
      lVar9 = 0;
      pTVar6 = pTVar8;
      do {
        TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(pTVar6);
        lVar9 = lVar9 + -0x9060;
        pTVar6 = pTVar6 + 1;
      } while (newsize * -0x9060 - lVar9 != 0);
    }
    lVar9 = this->fNElements;
    if (newsize <= this->fNElements) {
      lVar9 = newsize;
    }
    if (lVar9 < 1) {
      lVar11 = 0;
    }
    else {
      lVar10 = 0;
      lVar11 = 0;
      do {
        pTVar6 = this->fStore;
        puVar1 = (undefined8 *)
                 ((long)(pTVar6->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x28);
        puVar2 = (undefined8 *)
                 ((long)(pTVar8->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x28);
        *puVar2 = *puVar1;
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)(puVar2 + 1),(TPZManVector<int,_100> *)(puVar1 + 1));
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)
                   ((long)(pTVar8->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                   lVar10 + -0x20),
                   (TPZManVector<int,_100> *)
                   ((long)(pTVar6->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                   lVar10 + -0x20));
        TPZManVector<std::complex<long_double>,_1000>::operator=
                  ((TPZManVector<std::complex<long_double>,_1000> *)
                   ((long)&(((TPZManVector<std::complex<long_double>,_1000> *)
                            ((pTVar8->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>
                             .fExtAlloc + -1))->super_TPZVec<std::complex<long_double>_>).
                           _vptr_TPZVec + lVar10),
                   (TPZManVector<std::complex<long_double>,_1000> *)
                   ((long)&(((TPZManVector<std::complex<long_double>,_1000> *)
                            ((pTVar6->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>
                             .fExtAlloc + -1))->super_TPZVec<std::complex<long_double>_>).
                           _vptr_TPZVec + lVar10));
        TPZManVector<int,_1000>::operator=
                  ((TPZManVector<int,_1000> *)
                   ((long)(pTVar8->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar10 + -0x20)
                   ,(TPZManVector<int,_1000> *)
                    ((long)(pTVar6->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar10 + -0x20
                    ));
        *(undefined4 *)(puVar2 + 0x120a) = *(undefined4 *)(puVar1 + 0x120a);
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x9060;
      } while (lVar9 != lVar11);
    }
    lVar9 = newsize - lVar11;
    if (lVar9 != 0 && lVar11 <= newsize) {
      pTVar6 = pTVar8 + lVar11;
      do {
        iVar4 = object->fNumEq;
        pTVar6->fSymmetric = object->fSymmetric;
        pTVar6->fNumEq = iVar4;
        TPZManVector<int,_100>::operator=
                  (&(pTVar6->fEqStart).super_TPZManVector<int,_100>,
                   &(object->fEqStart).super_TPZManVector<int,_100>);
        TPZManVector<int,_100>::operator=
                  (&(pTVar6->fEqNumber).super_TPZManVector<int,_100>,
                   &(object->fEqNumber).super_TPZManVector<int,_100>);
        TPZManVector<std::complex<long_double>,_1000>::operator=
                  (&(pTVar6->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>,
                   &(object->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>);
        TPZManVector<int,_1000>::operator=
                  (&(pTVar6->fIndex).super_TPZManVector<int,_1000>,
                   &(object->fIndex).super_TPZManVector<int,_1000>);
        pTVar6->fLastTerm = object->fLastTerm;
        pTVar6 = pTVar6 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    pTVar6 = this->fStore;
    if (pTVar6 != (TPZEqnArray<std::complex<long_double>_> *)0x0) {
      lVar9 = *(long *)&pTVar6[-1].field_0x9058;
      if (lVar9 != 0) {
        lVar11 = lVar9 * 0x9060;
        do {
          TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray
                    ((TPZEqnArray<std::complex<long_double>_> *)
                     ((long)pTVar6[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar11 + -0x28));
          lVar11 = lVar11 + -0x9060;
        } while (lVar11 != 0);
      }
      operator_delete__(&pTVar6[-1].fLastTerm,lVar9 * 0x9060 | 0x10);
      this->fStore = (TPZEqnArray<std::complex<long_double>_> *)0x0;
    }
    this->fStore = pTVar8;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}